

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O0

void Hop_ObjCreateChoice(Hop_Obj_t *pOld,Hop_Obj_t *pNew)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pNewRepr;
  Hop_Obj_t *pOldRepr;
  Hop_Obj_t *pNew_local;
  Hop_Obj_t *pOld_local;
  
  if ((pOld != (Hop_Obj_t *)0x0) && (pNew != (Hop_Obj_t *)0x0)) {
    pHVar1 = Hop_ObjRepr(pOld);
    pHVar2 = Hop_ObjRepr(pNew);
    if (pHVar2 != pHVar1) {
      (pHVar2->field_0).pData = pHVar1;
    }
    return;
  }
  __assert_fail("pOld != NULL && pNew != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopObj.c"
                ,0x108,"void Hop_ObjCreateChoice(Hop_Obj_t *, Hop_Obj_t *)");
}

Assistant:

void Hop_ObjCreateChoice( Hop_Obj_t * pOld, Hop_Obj_t * pNew )
{
    Hop_Obj_t * pOldRepr;
    Hop_Obj_t * pNewRepr;
    assert( pOld != NULL && pNew != NULL );
    pOldRepr = Hop_ObjRepr(pOld);
    pNewRepr = Hop_ObjRepr(pNew);
    if ( pNewRepr != pOldRepr )
        pNewRepr->pData = pOldRepr;
}